

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

aiNode * __thiscall
Assimp::XGLImporter::ReadObject(XGLImporter *this,TempScope *scope,bool skipFirst,char *closetag)

{
  _Rb_tree_header *p_Var1;
  pointer ppaVar2;
  pointer ppaVar3;
  pointer __last;
  bool bVar4;
  int iVar5;
  _Rb_tree_color _Var6;
  uint uVar7;
  aiNode *this_00;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  uint *__s;
  aiNode **__s_00;
  ulong uVar10;
  uint i_1;
  long lVar11;
  pointer puVar12;
  void *pvVar13;
  float fVar14;
  long lVar15;
  ulong uVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshes;
  vector<aiNode_*,_std::allocator<aiNode_*>_> children;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  void *local_b8;
  long lStack_b0;
  long local_a8;
  string local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [56];
  
  local_68._48_8_ = closetag;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  local_b8 = (void *)0x0;
  lStack_b0 = 0;
  local_a8 = 0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  if (skipFirst) goto LAB_00545686;
  do {
    bVar4 = ReadElementUpToClosing(this,(char *)local_68._48_8_);
    __last = local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar12 = local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (!bVar4) {
      if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar16 = (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        lVar11 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::XGLImporter::SortMeshByMaterialId>>
                  ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                   (ulong)(((uint)lVar11 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<Assimp::XGLImporter::SortMeshByMaterialId>)scope);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::XGLImporter::SortMeshByMaterialId>>
                  ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )puVar12,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__last,(_Iter_comp_iter<Assimp::XGLImporter::SortMeshByMaterialId>)scope);
        puVar12 = local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar7 = (uint)((ulong)((long)puVar12 -
                            (long)local_d8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      this_00->mNumMeshes = uVar7;
      if (uVar7 != 0) {
        uVar10 = (long)puVar12 -
                 (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start & 0x3fffffffc;
        __s = (uint *)operator_new__(uVar10);
        uVar16 = 0;
        memset(__s,0,uVar10);
        this_00->mMeshes = __s;
        do {
          this_00->mMeshes[uVar16] =
               local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar16 < this_00->mNumMeshes);
      }
      pvVar13 = local_b8;
      uVar7 = (uint)((ulong)(lStack_b0 - (long)local_b8) >> 3);
      this_00->mNumChildren = uVar7;
      if (uVar7 != 0) {
        uVar10 = lStack_b0 - (long)local_b8 & 0x7fffffff8;
        __s_00 = (aiNode **)operator_new__(uVar10);
        uVar16 = 0;
        memset(__s_00,0,uVar10);
        this_00->mChildren = __s_00;
        do {
          this_00->mChildren[uVar16] = *(aiNode **)((long)pvVar13 + uVar16 * 8);
          *(aiNode **)(*(long *)((long)local_b8 + uVar16 * 8) + 0x448) = this_00;
          uVar16 = uVar16 + 1;
          pvVar13 = local_b8;
        } while (uVar16 < this_00->mNumChildren);
      }
      if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b8 != (void *)0x0) {
        operator_delete(local_b8,local_a8 - (long)local_b8);
      }
      return this_00;
    }
LAB_00545686:
    GetElementName_abi_cxx11_(&local_98,this);
    iVar5 = std::__cxx11::string::compare((char *)&local_98);
    if (iVar5 == 0) {
      ppaVar3 = (scope->meshes_linear).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppaVar2 = (scope->meshes_linear).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar4 = ReadMesh(this,scope);
      if (bVar4) {
        lVar15 = (long)ppaVar3 - (long)ppaVar2 >> 3;
        lVar11 = (long)(scope->meshes_linear).
                       super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(scope->meshes_linear).
                       super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        if (lVar11 != lVar15) {
          do {
            local_78._0_4_ = (int)lVar15;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&local_d8,(uint *)local_78);
            lVar15 = lVar15 + 1;
          } while (lVar11 != lVar15);
        }
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_98);
      if (iVar5 == 0) {
        ReadMaterial(this,scope);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_98);
        if (iVar5 == 0) {
          local_78._0_8_ = ReadObject(this,scope,false,"object");
          std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                    ((vector<aiNode*,std::allocator<aiNode*>> *)&local_b8,(aiNode **)local_78);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_98);
          if (iVar5 != 0) {
            iVar5 = std::__cxx11::string::compare((char *)&local_98);
            if (iVar5 == 0) {
              _Var6 = ReadIndexFromText(this);
              p_Var8 = (scope->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var1 = &(scope->meshes)._M_t._M_impl.super__Rb_tree_header;
              p_Var9 = &p_Var1->_M_header;
              if (p_Var8 == (_Rb_tree_node_base *)0x0) {
LAB_0054585b:
                local_78._0_8_ = (aiNode *)local_68;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_78,"<meshref> index out of range","");
                LogFunctions<Assimp::XGLImporter>::ThrowException((string *)local_78);
                p_Var9 = &p_Var1->_M_header;
                if ((aiNode *)local_78._0_8_ != (aiNode *)local_68) {
                  operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
                }
              }
              else {
                do {
                  bVar4 = p_Var8[1]._M_color < _Var6;
                  if (!bVar4) {
                    p_Var9 = p_Var8;
                  }
                  p_Var8 = (&p_Var8->_M_left)[bVar4];
                } while (p_Var8 != (_Base_ptr)0x0);
                if (((_Rb_tree_header *)p_Var9 == p_Var1) || (_Var6 < p_Var9[1]._M_color))
                goto LAB_0054585b;
              }
              for (; ((_Rb_tree_header *)p_Var9 != p_Var1 && (p_Var9[1]._M_color == _Var6));
                  p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
                local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
                ppaVar3 = (scope->meshes_linear).
                          super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar16 = (ulong)((long)(scope->meshes_linear).
                                       super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)ppaVar3) >>
                         3;
                fVar14 = (float)uVar16;
                if (fVar14 != 0.0) {
                  uVar10 = 0;
                  do {
                    if (ppaVar3[uVar10] == (aiMesh *)p_Var9[1]._M_parent) {
                      if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish ==
                          local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<unsigned_int,std::allocator<unsigned_int>>::
                        _M_realloc_insert<unsigned_int_const&>
                                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_d8,
                                   (iterator)
                                   local_d8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,(uint *)local_78);
                      }
                      else {
                        *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish = (uint)uVar10;
                        local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish =
                             local_d8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish + 1;
                      }
                      break;
                    }
                    uVar10 = uVar10 + 1;
                    local_78._0_4_ = (int)uVar10;
                  } while ((uVar16 & 0xffffffff) != uVar10);
                }
                if ((uint)fVar14 <= (uint)local_78._0_4_) {
                  __assert_fail("i < mcount",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/XGL/XGLLoader.cpp"
                                ,0x1a4,
                                "aiNode *Assimp::XGLImporter::ReadObject(TempScope &, bool, const char *)"
                               );
                }
              }
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)&local_98);
              if (iVar5 == 0) {
                ReadTrafo((aiMatrix4x4 *)local_78,this);
                (this_00->mTransformation).d1 = (float)local_68._32_4_;
                (this_00->mTransformation).d2 = (float)local_68._36_4_;
                (this_00->mTransformation).d3 = (float)local_68._40_4_;
                (this_00->mTransformation).d4 = (float)local_68._44_4_;
                (this_00->mTransformation).c1 = (float)local_68._16_4_;
                (this_00->mTransformation).c2 = (float)local_68._20_4_;
                (this_00->mTransformation).c3 = (float)local_68._24_4_;
                (this_00->mTransformation).c4 = (float)local_68._28_4_;
                (this_00->mTransformation).b1 = (float)local_68._0_4_;
                (this_00->mTransformation).b2 = (float)local_68._4_4_;
                (this_00->mTransformation).b3 = (float)local_68._8_4_;
                (this_00->mTransformation).b4 = (float)local_68._12_4_;
                (this_00->mTransformation).a1 = (float)local_78._0_4_;
                (this_00->mTransformation).a2 = (float)local_78._4_4_;
                (this_00->mTransformation).a3 = (float)local_78._8_4_;
                (this_00->mTransformation).a4 = (float)local_78._12_4_;
              }
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

aiNode* XGLImporter::ReadObject(TempScope& scope, bool skipFirst, const char* closetag)
{
    aiNode *nd = new aiNode;
    std::vector<aiNode*> children;
    std::vector<unsigned int> meshes;

    try {
        while (skipFirst || ReadElementUpToClosing(closetag))   {
            skipFirst = false;

            const std::string& s = GetElementName();
            if (s == "mesh") {
                const size_t prev = scope.meshes_linear.size();
                if(ReadMesh(scope)) {
                    const size_t newc = scope.meshes_linear.size();
                    for(size_t i = 0; i < newc-prev; ++i) {
                        meshes.push_back(static_cast<unsigned int>(i+prev));
                    }
                }
            }
            else if (s == "mat") {
                ReadMaterial(scope);
            }
            else if (s == "object") {
                children.push_back(ReadObject(scope));
            }
            else if (s == "objectref") {
                // XXX
            }
            else if (s == "meshref") {
                const unsigned int id = static_cast<unsigned int>( ReadIndexFromText() );

                std::multimap<unsigned int, aiMesh*>::iterator it = scope.meshes.find(id), end = scope.meshes.end();
                if (it == end) {
                    ThrowException("<meshref> index out of range");
                }

                for(; it != end && (*it).first == id; ++it) {
                    // ok, this is n^2 and should get optimized one day
                    aiMesh* const m = (*it).second;

                    unsigned int i = 0, mcount = static_cast<unsigned int>(scope.meshes_linear.size());
                    for(; i < mcount; ++i) {
                        if (scope.meshes_linear[i] == m) {
                            meshes.push_back(i);
                            break;
                        }
                    }

                    ai_assert(i < mcount);
                }
            }
            else if (s == "transform") {
                nd->mTransformation = ReadTrafo();
            }
        }

    } catch(...) {
        for(aiNode* ch : children) {
            delete ch;
        }
        throw;
    }

    // FIX: since we used std::multimap<> to keep meshes by id, mesh order now depends on the behaviour
    // of the multimap implementation with respect to the ordering of entries with same values.
    // C++11 gives the guarantee that it uses insertion order, before it is implementation-specific.
    // Sort by material id to always guarantee a deterministic result.
    std::sort(meshes.begin(), meshes.end(), SortMeshByMaterialId(scope));

    // link meshes to node
    nd->mNumMeshes = static_cast<unsigned int>(meshes.size());
    if (nd->mNumMeshes) {
        nd->mMeshes = new unsigned int[nd->mNumMeshes]();
        for(unsigned int i = 0; i < nd->mNumMeshes; ++i) {
            nd->mMeshes[i] = meshes[i];
        }
    }

    // link children to parent
    nd->mNumChildren = static_cast<unsigned int>(children.size());
    if (nd->mNumChildren) {
        nd->mChildren = new aiNode*[nd->mNumChildren]();
        for(unsigned int i = 0; i < nd->mNumChildren; ++i) {
            nd->mChildren[i] = children[i];
            children[i]->mParent = nd;
        }
    }

    return nd;
}